

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection_segment.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ColumnDataCollectionSegment::ReadVectorInternal
          (ColumnDataCollectionSegment *this,ChunkManagementState *state,
          VectorDataIndex vector_index,Vector *result)

{
  vector<duckdb::VectorMetaData,_true> *this_00;
  idx_t type_size;
  reference pvVar1;
  ColumnDataAllocator *pCVar2;
  data_ptr_t pdVar3;
  validity_t *pvVar4;
  data_ptr_t base_ptr;
  idx_t new_size;
  idx_t count;
  VectorDataIndex __n;
  idx_t target_offset;
  ValidityMask current_validity;
  ValidityMask local_50;
  
  type_size = GetTypeIdSize((result->type).physical_type_);
  this_00 = &this->vector_data;
  pvVar1 = vector<duckdb::VectorMetaData,_true>::get<true>(this_00,vector_index.index);
  pCVar2 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
  pdVar3 = ColumnDataAllocator::GetDataPointer(pCVar2,state,pvVar1->block_id,pvVar1->offset);
  if (((pvVar1->next_data).index == 0xffffffffffffffff) && (state->properties != DISALLOW_ZERO_COPY)
     ) {
    pvVar4 = GetValidityPointer(pdVar3,type_size,(ulong)pvVar1->count);
    result->data = pdVar3;
    FlatVector::VerifyFlatVector(result);
    ::std::__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>::
    reset((__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2> *)
          &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = pvVar4;
    (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
    new_size = (idx_t)pvVar1->count;
  }
  else {
    new_size = 0;
    __n.index = vector_index.index;
    while (__n.index != 0xffffffffffffffff) {
      pvVar1 = vector<duckdb::VectorMetaData,_true>::get<true>(this_00,__n.index);
      new_size = new_size + pvVar1->count;
      __n.index = (pvVar1->next_data).index;
    }
    target_offset = 0;
    Vector::Resize(result,0,new_size);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    while (vector_index.index != 0xffffffffffffffff) {
      pvVar1 = vector<duckdb::VectorMetaData,_true>::get<true>(this_00,vector_index.index);
      pCVar2 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
      base_ptr = ColumnDataAllocator::GetDataPointer(pCVar2,state,pvVar1->block_id,pvVar1->offset);
      count = (idx_t)pvVar1->count;
      pvVar4 = GetValidityPointer(base_ptr,type_size,count);
      if (type_size != 0) {
        switchD_016b0717::default(pdVar3 + target_offset * type_size,base_ptr,count * type_size);
        count = (idx_t)pvVar1->count;
      }
      local_50.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_50.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_50.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
      local_50.super_TemplatedValidityMask<unsigned_long>.validity_mask = pvVar4;
      ValidityMask::SliceInPlace(&result->validity,&local_50,target_offset,0,count);
      target_offset = target_offset + pvVar1->count;
      vector_index.index = (pvVar1->next_data).index;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_50.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
  }
  return new_size;
}

Assistant:

idx_t ColumnDataCollectionSegment::ReadVectorInternal(ChunkManagementState &state, VectorDataIndex vector_index,
                                                      Vector &result) {
	auto &vector_type = result.GetType();
	auto internal_type = vector_type.InternalType();
	auto type_size = GetTypeIdSize(internal_type);
	auto &vdata = GetVectorData(vector_index);

	auto base_ptr = allocator->GetDataPointer(state, vdata.block_id, vdata.offset);
	auto validity_data = GetValidityPointer(base_ptr, type_size, vdata.count);
	if (!vdata.next_data.IsValid() && state.properties != ColumnDataScanProperties::DISALLOW_ZERO_COPY) {
		// no next data, we can do a zero-copy read of this vector
		FlatVector::SetData(result, base_ptr);
		FlatVector::Validity(result).Initialize(validity_data, STANDARD_VECTOR_SIZE);
		return vdata.count;
	}

	// the data for this vector is spread over multiple vector data entries
	// we need to copy over the data for each of the vectors
	// first figure out how many rows we need to copy by looping over all of the child vector indexes
	idx_t vector_count = 0;
	auto next_index = vector_index;
	while (next_index.IsValid()) {
		auto &current_vdata = GetVectorData(next_index);
		vector_count += current_vdata.count;
		next_index = current_vdata.next_data;
	}
	// resize the result vector
	result.Resize(0, vector_count);
	next_index = vector_index;
	// now perform the copy of each of the vectors
	auto target_data = FlatVector::GetData(result);
	auto &target_validity = FlatVector::Validity(result);
	idx_t current_offset = 0;
	while (next_index.IsValid()) {
		auto &current_vdata = GetVectorData(next_index);
		base_ptr = allocator->GetDataPointer(state, current_vdata.block_id, current_vdata.offset);
		validity_data = GetValidityPointer(base_ptr, type_size, current_vdata.count);
		if (type_size > 0) {
			memcpy(target_data + current_offset * type_size, base_ptr, current_vdata.count * type_size);
		}
		ValidityMask current_validity(validity_data, STANDARD_VECTOR_SIZE);
		target_validity.SliceInPlace(current_validity, current_offset, 0, current_vdata.count);
		current_offset += current_vdata.count;
		next_index = current_vdata.next_data;
	}
	return vector_count;
}